

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha224.c
# Opt level: O0

void SHA224_256Finalize(SHA256Context *context,uint8_t Pad_Byte)

{
  int local_18;
  int i;
  uint8_t Pad_Byte_local;
  SHA256Context *context_local;
  
  SHA224_256PadMessage(context,Pad_Byte);
  for (local_18 = 0; local_18 < 0x40; local_18 = local_18 + 1) {
    context->Message_Block[local_18] = '\0';
  }
  context->Length_Low = 0;
  context->Length_High = 0;
  context->Computed = 1;
  return;
}

Assistant:

static void SHA224_256Finalize(SHA256Context *context, uint8_t Pad_Byte)
{
    int i;
    SHA224_256PadMessage(context, Pad_Byte);
    /* message may be sensitive, so clear it out */
    for (i = 0; i < SHA256_Message_Block_Size; ++i)
    {
        context->Message_Block[i] = 0;
    }
    context->Length_Low = 0;  /* and clear length */
    context->Length_High = 0;
    context->Computed = 1;
}